

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,boost::iterators::random_access_traversal_tag>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  initializer_list<int> *local_28;
  initializer_list<int> *rhs_local;
  char *op_local;
  iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
  *lhs_local;
  
  local_28 = (initializer_list<int> *)op;
  rhs_local = (initializer_list<int> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>_>,_true>
            (&local_58,
             (iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::initializer_list<int>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }